

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skin.cpp
# Opt level: O0

void rw::skinAlways(void *object,int32 param_2,int32 param_3)

{
  Skin *pSVar1;
  Skin *skin;
  Geometry *geo;
  Atomic *atomic;
  int32 param_2_local;
  int32 param_1_local;
  void *object_local;
  
  if ((*(Geometry **)((long)object + 0x28) != (Geometry *)0x0) &&
     (pSVar1 = Skin::get(*(Geometry **)((long)object + 0x28)), pSVar1 != (Skin *)0x0)) {
    Skin::setPipeline((Atomic *)object,1);
  }
  return;
}

Assistant:

static void
skinAlways(void *object, int32, int32)
{
	Atomic *atomic = (Atomic*)object;
	Geometry *geo = atomic->geometry;
	if(geo == nil) return;
	Skin *skin = Skin::get(geo);
	if(skin == nil) return;
	Skin::setPipeline((Atomic*)object, 1);
}